

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O1

void __thiscall
SubprocessTestInterruptParent::~SubprocessTestInterruptParent(SubprocessTestInterruptParent *this)

{
  (this->super_SubprocessTest).super_Test._vptr_Test = (_func_int **)&PTR__SubprocessTest_001fd178;
  SubprocessSet::~SubprocessSet(&(this->super_SubprocessTest).subprocs_);
  operator_delete(this,0x2d8);
  return;
}

Assistant:

TEST_F(SubprocessTest, InterruptParent) {
  Subprocess* subproc = subprocs_.Add("kill -INT $PPID ; sleep 1");
  ASSERT_NE((Subprocess *) 0, subproc);

  while (!subproc->Done()) {
    bool interrupted = subprocs_.DoWork(NULL);
    if (interrupted)
      return;
  }

  ASSERT_FALSE("We should have been interrupted");
}